

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsThreadList::clean(TadsThreadList *this)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  TadsThreadLink *nxt;
  TadsThreadLink *prv;
  TadsThreadLink *cur;
  undefined8 *local_18;
  undefined8 *local_10;
  
  OS_Mutex::lock((OS_Mutex *)0x24f1bc);
  local_18 = (undefined8 *)0x0;
  puVar1 = *(undefined8 **)(in_RDI + 0x10);
  while (local_10 = puVar1, local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)local_10[1];
    iVar2 = CVmWeakRef::test((CVmWeakRef *)*local_10);
    if (iVar2 == 0) {
      if (local_18 == (undefined8 *)0x0) {
        *(undefined8 **)(in_RDI + 0x10) = puVar1;
      }
      else {
        local_18[1] = puVar1;
      }
      if (local_10 != (undefined8 *)0x0) {
        TadsThreadLink::~TadsThreadLink((TadsThreadLink *)0x24f24b);
        operator_delete(local_10,0x10);
      }
    }
    else {
      local_18 = local_10;
    }
  }
  OS_Mutex::unlock((OS_Mutex *)0x24f27b);
  return;
}

Assistant:

void clean()
    {
        /* lock the list */
        mu->lock();

        /* 
         *   Unlink the thread from the list.  It's possible that it's not in
         *   the list any longer, since wait_all() removes threads before
         *   waiting for them to exit.  
         */
        TadsThreadLink *cur, *prv, *nxt;
        for (prv = 0, cur = head ; cur != 0 ; cur = nxt)
        {
            /* remember the next thread */
            nxt = cur->nxt;
            
            /* check to see if this thread is still alive */
            if (cur->thread->test())
            {
                /* it's still alive - keep it in the list */
                prv = cur;
            }
            else
            {
                /* this thread is gone - remove the link */
                if (prv != 0)
                    prv->nxt = nxt;
                else
                    head = nxt;

                /* delete the link */
                delete cur;
            }
        }

        /* done with the list lock */
        mu->unlock();
    }